

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

CommandOptions * read_isxd_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **__s;
  bool bVar1;
  int iVar2;
  long *plVar3;
  Dictionary *this;
  byte_t *pbVar4;
  reference ppIVar5;
  AESDecContext *this_00;
  HMACContext *this_01;
  uint *puVar6;
  IFileReaderFactory *in_RDX;
  uint local_728;
  long *local_700;
  Result_t local_698 [111];
  allocator<char> local_629;
  string local_628 [32];
  string local_608 [112];
  char local_598 [4];
  ui32_t write_count;
  char filename [256];
  FileWriter local_490 [8];
  FileWriter OutFile;
  Result_t local_458 [108];
  uint local_3ec;
  char local_3e8 [4];
  ui32_t i_1;
  char name_format [64];
  uint local_39c;
  Result_t local_398 [4];
  ui32_t last_frame;
  undefined1 local_330 [112];
  WriterInfo Info;
  GenericStreamTextBasedSet *text_object;
  _List_node_base *local_1a0;
  _List_iterator<ASDCP::MXF::InterchangeObject_*> local_198;
  iterator i;
  undefined1 local_128 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  allocator<char> local_a1;
  string local_a0 [39];
  undefined1 local_79;
  uint local_78;
  ui32_t frame_count;
  FrameBuffer local_68 [8];
  FrameBuffer FrameBuffer;
  MXFReader local_40 [8];
  MXFReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  Result_t *result;
  
  AS_02::ISXD::MXFReader::MXFReader(local_40,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(local_68);
  local_78 = 0;
  local_79 = 0;
  __s = fileReaderFactory[0xb]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,(char *)__s,&local_a1);
  AS_02::ISXD::MXFReader::OpenRead((string *)Options);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar2) {
    ASDCP::FrameBuffer::Capacity((int)&object_list + 0x10);
    Kumu::Result_t::operator=
              ((Result_t *)Options,
               (Result_t *)
               &object_list.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size);
    Kumu::Result_t::~Result_t
              ((Result_t *)
               &object_list.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size);
    AS_02::ISXD::MXFReader::AS02IndexReader();
    local_78 = AS_02::MXF::AS02IndexReader::GetDuration();
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar2) {
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_128);
    plVar3 = (long *)AS_02::ISXD::MXFReader::OP1aHeader();
    this = (Dictionary *)ASDCP::DefaultSMPTEDict();
    pbVar4 = ASDCP::Dictionary::ul(this,MDD_GenericStreamTextBasedSet);
    (**(code **)(*plVar3 + 0xb0))(&i,plVar3,pbVar4);
    Kumu::Result_t::~Result_t((Result_t *)&i);
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::_List_iterator(&local_198);
    local_1a0 = (_List_node_base *)
                std::__cxx11::
                list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                         *)local_128);
    local_198._M_node = local_1a0;
    while( true ) {
      text_object = (GenericStreamTextBasedSet *)
                    std::__cxx11::
                    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    ::end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                           *)local_128);
      bVar1 = std::operator!=(&local_198,(_Self *)&text_object);
      if (!bVar1) break;
      ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_198);
      if (*ppIVar5 == (InterchangeObject *)0x0) {
        local_700 = (long *)0x0;
      }
      else {
        local_700 = (long *)__dynamic_cast(*ppIVar5,&ASDCP::MXF::InterchangeObject::typeinfo,
                                           &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo);
      }
      if (local_700 == (long *)0x0) {
        __assert_fail("text_object",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x387,
                      "Result_t read_isxd_file(CommandOptions &, const Kumu::IFileReaderFactory &)")
        ;
      }
      (**(code **)(*local_700 + 0x88))(local_700,_stderr);
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_198);
    }
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_128);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x100) != 0)) {
    this_00 = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this_00);
    ASDCP::AESDecContext::InitKey((uchar *)&Info.LabelSetType);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info.LabelSetType);
    Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000) != 0)) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_330 + 0x68));
      AS_02::ISXD::MXFReader::FillWriterInfo((WriterInfo *)local_330);
      Kumu::Result_t::~Result_t((Result_t *)local_330);
      if ((Info.CryptographicKeyID[9] & 1) == 0) {
        fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
      }
      else {
        this_01 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_01);
        ASDCP::HMACContext::InitKey((uchar *)local_398,(LabelSet_t)this_01);
        Kumu::Result_t::operator=((Result_t *)Options,local_398);
        Kumu::Result_t::~Result_t(local_398);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(local_330 + 0x68));
    }
  }
  if (*(int *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    local_728 = local_78;
  }
  else {
    local_728 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  }
  local_39c = *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) + local_728;
  if (local_78 < local_39c) {
    local_39c = local_78;
  }
  snprintf(local_3e8,0x40,"%%s%%0%du.%s",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory,
           fileReaderFactory[0xc]._vptr_IFileReaderFactory);
  local_3ec = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  while (iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options),
        -1 < iVar2 && local_3ec < local_39c) {
    AS_02::ISXD::MXFReader::ReadFrame
              ((uint)local_458,(FrameBuffer *)local_40,(AESDecContext *)(ulong)local_3ec,
               (HMACContext *)local_68);
    Kumu::Result_t::operator=((Result_t *)Options,local_458);
    Kumu::Result_t::~Result_t(local_458);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100000000) == 0))
    {
      Kumu::FileWriter::FileWriter(local_490);
      snprintf(local_598,0x100,local_3e8,fileReaderFactory[6]._vptr_IFileReaderFactory,
               (ulong)local_3ec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_628,local_598,&local_629);
      Kumu::FileWriter::OpenWrite(local_608);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_608);
      Kumu::Result_t::~Result_t((Result_t *)local_608);
      std::__cxx11::string::~string(local_628);
      std::allocator<char>::~allocator(&local_629);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar2) {
        puVar6 = (uint *)ASDCP::FrameBuffer::Data(local_68);
        ASDCP::FrameBuffer::Size(local_68);
        Kumu::FileWriter::Write((uchar *)local_698,(uint)local_490,puVar6);
        Kumu::Result_t::operator=((Result_t *)Options,local_698);
        Kumu::Result_t::~Result_t(local_698);
      }
      Kumu::FileWriter::~FileWriter(local_490);
    }
    local_3ec = local_3ec + 1;
  }
  local_79 = 1;
  ASDCP::FrameBuffer::~FrameBuffer(local_68);
  AS_02::ISXD::MXFReader::~MXFReader(local_40);
  return Options;
}

Assistant:

Result_t
read_isxd_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::ISXD::MXFReader    Reader(fileReaderFactory);
  ASDCP::FrameBuffer  FrameBuffer;
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = FrameBuffer.Capacity(Options.fb_size);
      frame_count = Reader.AS02IndexReader().GetDuration();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      std::list<MXF::InterchangeObject*> object_list;
      Reader.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

      std::list<MXF::InterchangeObject*>::iterator i;
      for ( i = object_list.begin(); i != object_list.end(); ++i )
	{
	  MXF::GenericStreamTextBasedSet *text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(*i);
	  assert(text_object);
	  text_object->Dump(stderr);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.%s", Options.number_width, Options.extension);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ! Options.no_write_flag )
	    {
	      Kumu::FileWriter OutFile;
	      char filename[256];
	      ui32_t write_count;
	      snprintf(filename, 256, name_format, Options.file_prefix, i);
	      result = OutFile.OpenWrite(filename);

	      if ( ASDCP_SUCCESS(result) )
		result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	    }
	}
    }

  return result;
}